

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.c
# Opt level: O0

EVP_PKEY * X509_PUBKEY_get0(X509_PUBKEY *key)

{
  char *in_RDI;
  char *unaff_retaddr;
  undefined8 in_stack_fffffffffffffff8;
  int line;
  EVP_PKEY *pEVar1;
  
  line = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  if (in_RDI == (char *)0x0) {
    ERR_new();
    ERR_set_debug(unaff_retaddr,line,in_RDI);
    ERR_set_error(0xb,0xc0102,(char *)0x0);
    pEVar1 = (EVP_PKEY *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    ERR_new();
    ERR_set_debug(unaff_retaddr,line,in_RDI);
    ERR_set_error(6,0x72,(char *)0x0);
    pEVar1 = (EVP_PKEY *)0x0;
  }
  else {
    pEVar1 = *(EVP_PKEY **)(in_RDI + 0x10);
  }
  return pEVar1;
}

Assistant:

EVP_PKEY *X509_PUBKEY_get0(const X509_PUBKEY *key)
{
    if (key == NULL) {
        ERR_raise(ERR_LIB_X509, ERR_R_PASSED_NULL_PARAMETER);
        return NULL;
    }

    if (key->pkey == NULL) {
        /* We failed to decode the key when we loaded it, or it was never set */
        ERR_raise(ERR_LIB_EVP, EVP_R_DECODE_ERROR);
        return NULL;
    }

    return key->pkey;
}